

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSocket.cc
# Opt level: O1

ssize_t __thiscall
ClientSocket::read_abi_cxx11_(ClientSocket *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  char buffer [256];
  undefined1 auStack_128 [264];
  
  *(ClientSocket **)this = this + 1;
  this->_server = (Server *)0x0;
  *(undefined1 *)&this[1]._fileDescriptor = 0;
  memset(auStack_128,0,0x100);
  while( true ) {
    sVar1 = recv(*(int *)CONCAT44(in_register_00000034,__fd),auStack_128,0x100,0x40);
    if (sVar1 < 1) break;
    auStack_128[sVar1] = 0;
    std::__cxx11::string::append((char *)this);
  }
  return (ssize_t)this;
}

Assistant:

std::string ClientSocket::read()
{
  std::string message;

  char buffer[256] = { 0 };
  ssize_t numBytes = 0;

  while( ( numBytes = recv( _fileDescriptor, buffer, sizeof(buffer), MSG_DONTWAIT ) ) > 0 )
  {
    buffer[numBytes]  = 0;
    message          += buffer;
  }

  return message;
}